

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

int64_t duckdb::Date::EpochMicroseconds(date_t date)

{
  bool bVar1;
  ConversionException *this;
  date_t date_00;
  allocator local_61;
  int64_t result;
  string local_58;
  string local_38;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>((long)date.days,86400000000,&result);
  if (bVar1) {
    return result;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Could not convert DATE (%s) to microseconds",&local_61);
  ToString_abi_cxx11_(&local_58,(Date *)(ulong)(uint)date.days,date_00);
  ConversionException::ConversionException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Date::EpochMicroseconds(date_t date) {
	int64_t result;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(date.days, Interval::MICROS_PER_DAY, result)) {
		throw ConversionException("Could not convert DATE (%s) to microseconds", Date::ToString(date));
	}
	return result;
}